

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::~InnerMap
          (InnerMap *this)

{
  if (((this->alloc_).arena_ == (Arena *)0x0) && (this->num_buckets_ != 1)) {
    clear(this);
    Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::Dealloc<void*>
              ((InnerMap *)this,this->table_,this->num_buckets_);
  }
  return;
}

Assistant:

~InnerMap() {
      if (alloc_.arena() == nullptr &&
          num_buckets_ != internal::kGlobalEmptyTableSize) {
        clear();
        Dealloc<void*>(table_, num_buckets_);
      }
    }